

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_ZeroFlag_Test::TestBody(FormatterTest_ZeroFlag_Test *this)

{
  bool bVar1;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_12;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_11;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_10;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  char (*in_stack_fffffffffffff958) [6];
  char *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  char *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  Type in_stack_fffffffffffff97c;
  AssertionResult *in_stack_fffffffffffff980;
  char (*in_stack_fffffffffffff988) [7];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  allocator *in_stack_fffffffffffff9d0;
  string local_478 [38];
  byte local_452;
  undefined1 local_451 [33];
  AssertionResult local_430 [3];
  string local_400 [38];
  byte local_3da;
  allocator local_3d9;
  string local_3d8 [32];
  AssertionResult local_3b8 [3];
  undefined1 local_381;
  string local_380 [38];
  byte local_35a;
  allocator local_359;
  string local_358 [32];
  AssertionResult local_338 [3];
  int local_308;
  undefined1 local_301;
  string local_300 [38];
  byte local_2da;
  allocator local_2d9;
  string local_2d8 [32];
  AssertionResult local_2b8 [2];
  longdouble local_298;
  string local_288 [32];
  AssertionResult local_268 [2];
  undefined8 local_248;
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined8 local_200;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined8 local_1b8;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined8 local_170;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined8 local_128;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  local_3c = 0x2a;
  fmt::v5::format<char[6],int>
            ((char (*) [6])in_stack_fffffffffffff988,(int *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,(char (*) [3])in_stack_fffffffffffff958,
             in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c09a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c0fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c155);
  local_94 = 0xffffffd6;
  fmt::v5::format<char[7],int>(in_stack_fffffffffffff988,(int *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c252);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c2b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c30d);
  local_dc = 0x2a;
  fmt::v5::format<char[7],unsigned_int>(in_stack_fffffffffffff988,(uint *)in_stack_fffffffffffff980)
  ;
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c40a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c46d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c4c5);
  local_128 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long>(in_stack_fffffffffffff988,(long *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c5c3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c626);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c67e);
  local_170 = 0x2a;
  fmt::v5::format<char[7],unsigned_long>
            (in_stack_fffffffffffff988,(unsigned_long *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c77c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c7df);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c837);
  local_1b8 = 0xffffffffffffffd6;
  fmt::v5::format<char[7],long_long>
            (in_stack_fffffffffffff988,(longlong *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14c935);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14c998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14c9f0);
  local_200 = 0x2a;
  fmt::v5::format<char[7],unsigned_long_long>
            (in_stack_fffffffffffff988,(unsigned_long_long *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14caee);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14cb51);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14cba9);
  local_248 = 0xc045000000000000;
  fmt::v5::format<char[7],double>(in_stack_fffffffffffff988,(double *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14ccad);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14cd10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14cd68);
  local_298 = (longdouble)-42.0;
  fmt::v5::format<char[7],long_double>
            (in_stack_fffffffffffff988,(longdouble *)in_stack_fffffffffffff980);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             in_stack_fffffffffffff960,in_stack_fffffffffffff958,in_stack_fffffffffffff950);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14ce67);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14ceca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14cf22);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d8,"missing \'}\' in format string",&local_2d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    local_2da = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_301 = 99;
      fmt::v5::format<char[5],char>
                ((char (*) [5])in_stack_fffffffffffff988,&in_stack_fffffffffffff980->success_);
      std::__cxx11::string::~string(local_300);
    }
    if ((local_2da & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff980,
                 (char (*) [101])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_308 = 2;
    }
    else {
      local_308 = 0;
    }
    std::__cxx11::string::~string(local_2d8);
    if (local_308 != 0) goto LAB_0014d2c5;
  }
  else {
LAB_0014d2c5:
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14d2e1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14d344);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14d39c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_358,"invalid format specifier for char",&local_359);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    local_35a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_381 = 99;
      fmt::v5::format<char[7],char>(in_stack_fffffffffffff988,&in_stack_fffffffffffff980->success_);
      std::__cxx11::string::~string(local_380);
    }
    if ((local_35a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff980,
                 (char (*) [103])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_308 = 3;
    }
    else {
      local_308 = 0;
    }
    std::__cxx11::string::~string(local_358);
    if (local_308 != 0) goto LAB_0014d73f;
  }
  else {
LAB_0014d73f:
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14d75b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14d7be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14d816);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (bVar1) {
    in_stack_fffffffffffff9d0 = &local_3d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d8,"format specifier requires numeric argument",in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    local_3da = 0;
    in_stack_fffffffffffff9cf = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff9cf) {
      fmt::v5::format<char[7],char[4]>
                (in_stack_fffffffffffff988,&in_stack_fffffffffffff980->success_);
      std::__cxx11::string::~string(local_400);
    }
    if ((local_3da & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff980,
                 (char (*) [105])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_308 = 4;
    }
    else {
      local_308 = 0;
    }
    std::__cxx11::string::~string(local_3d8);
    if (local_308 != 0) goto LAB_0014db92;
  }
  else {
LAB_0014db92:
    testing::Message::Message((Message *)in_stack_fffffffffffff980);
    testing::AssertionResult::failure_message((AssertionResult *)0x14dbae);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
               in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9d0,
               (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
    testing::Message::~Message((Message *)0x14dc0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14dc63);
  this_00 = local_430;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffff980 = (AssertionResult *)local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_451 + 1),"format specifier requires numeric argument",
               (allocator *)in_stack_fffffffffffff980);
    std::allocator<char>::~allocator((allocator<char> *)local_451);
    local_452 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff97c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff97c);
    if (bVar1) {
      fmt::v5::format<char[7],void*>(&this_00->success_,(void **)in_stack_fffffffffffff980);
      std::__cxx11::string::~string(local_478);
    }
    if ((local_452 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff980,
                 (char (*) [129])CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      local_308 = 5;
    }
    else {
      local_308 = 0;
    }
    std::__cxx11::string::~string((string *)(local_451 + 1));
    if (local_308 == 0) goto LAB_0014e08d;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff980);
  testing::AssertionResult::failure_message((AssertionResult *)0x14dfea);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
             in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff960);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffff9d0,
             (Message *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
  testing::Message::~Message((Message *)0x14e045);
LAB_0014e08d:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14e09a);
  return;
}

Assistant:

TEST(FormatterTest, ZeroFlag) {
  EXPECT_EQ("42", format("{0:0}", 42));
  EXPECT_EQ("-0042", format("{0:05}", -42));
  EXPECT_EQ("00042", format("{0:05}", 42u));
  EXPECT_EQ("-0042", format("{0:05}", -42l));
  EXPECT_EQ("00042", format("{0:05}", 42ul));
  EXPECT_EQ("-0042", format("{0:05}", -42ll));
  EXPECT_EQ("00042", format("{0:05}", 42ull));
  EXPECT_EQ("-0042", format("{0:05}", -42.0));
  EXPECT_EQ("-0042", format("{0:05}", -42.0l));
  EXPECT_THROW_MSG(format("{0:0", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:05}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:05}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:05}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}